

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::rotate
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          Dir dir)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  
  lVar3 = *(long *)this[2].rootNode;
  lVar8 = lVar3 + (long)x * 0x20;
  iVar1 = *(int *)(lVar8 + 0x10 + (ulong)(1 - dir) * 4);
  uVar5 = (ulong)dir;
  iVar2 = *(int *)(lVar3 + (long)iVar1 * 0x20 + 0x10 + uVar5 * 4);
  *(int *)(lVar8 + 0x10 + (ulong)(1 - dir) * 4) = iVar2;
  if ((long)iVar2 != -1) {
    lVar8 = (long)iVar2 * 0x20;
    *(uint *)(lVar3 + 0x18 + lVar8) = x + 1U | *(uint *)(lVar3 + 0x18 + lVar8) & 0x80000000;
  }
  puVar6 = (uint *)((long)x * 0x20 + lVar3 + 0x18);
  uVar7 = *puVar6 & 0x7fffffff;
  lVar8 = (long)iVar1 * 0x20 + lVar3;
  *(uint *)(lVar8 + 0x18) = *(uint *)(lVar8 + 0x18) & 0x80000000 | uVar7;
  if (uVar7 == 0) {
    piVar4 = this->rootNode;
  }
  else {
    lVar3 = lVar3 + (ulong)(uVar7 - 1) * 0x20;
    piVar4 = (int *)(lVar3 + (ulong)(*(int *)(lVar3 + 0x10 + uVar5 * 4) != x ^ dir) * 4 + 0x10);
  }
  *piVar4 = iVar1;
  *(LinkType *)(lVar8 + 0x10 + uVar5 * 4) = x;
  *puVar6 = iVar1 + 1U | *puVar6 & 0x80000000;
  return;
}

Assistant:

void rotate(LinkType x, Dir dir) {
    LinkType y = getChild(x, opposite(dir));
    LinkType yDir = getChild(y, dir);
    setChild(x, opposite(dir), yDir);
    if (yDir != kNoLink) setParent(yDir, x);

    LinkType pX = getParent(x);
    setParent(y, pX);

    if (pX == kNoLink)
      rootNode = y;
    else
      setChild(pX, Dir((x != getChild(pX, dir)) ^ dir), y);

    setChild(y, dir, x);
    setParent(x, y);
  }